

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32.cpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> *
anon_unknown.dwarf_5f39::createChecksumUsingOriginalConstant
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,string *hrp
          ,vector<unsigned_char,_std::allocator<unsigned_char>_> *dp)

{
  uint32_t uVar1;
  uint uVar2;
  size_type sVar3;
  byte *pbVar4;
  ulong local_70;
  size_type i;
  uint local_60;
  uint32_t mod;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_50;
  undefined1 local_38 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *dp_local;
  string *hrp_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *ret;
  
  c.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)dp;
  expandHrp(&local_50,hrp);
  cat((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,&local_50,
      (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
      c.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_50);
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,sVar3 + 6);
  uVar1 = polymod((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  local_60 = uVar1 ^ 1;
  i._7_1_ = 0;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)((long)&i + 6));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,6,(allocator<unsigned_char> *)((long)&i + 6));
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)((long)&i + 6));
  for (local_70 = 0; local_70 < 6; local_70 = local_70 + 1) {
    uVar2 = local_60 >> (('\x05' - (char)local_70) * '\x05' & 0x1fU);
    pbVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (__return_storage_ptr__,local_70);
    *pbVar4 = (byte)uVar2 & 0x1f;
  }
  i._7_1_ = 1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::vector<unsigned char>
    createChecksumUsingOriginalConstant(const std::string &hrp, const std::vector<unsigned char> &dp) {
        std::vector<unsigned char> c = cat(expandHrp(hrp), dp);
        c.resize(c.size() + CHECKSUM_LENGTH);
        uint32_t mod = polymod(c) ^ 1;
        std::vector<unsigned char> ret(CHECKSUM_LENGTH);
        for(std::vector<unsigned char>::size_type i = 0; i < CHECKSUM_LENGTH; ++i) {
            ret[i] = static_cast<unsigned char>((mod >> (5 * (5 - i))) & 31u);
        }
        return ret;
    }